

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  string line;
  string fileList;
  ifstream finList;
  
  cmCTest::GetBinaryDir_abi_cxx11_(&fileList,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::append((char *)&fileList);
  std::__cxx11::string::append((char *)&fileList);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&finList);
  poVar2 = std::operator<<((ostream *)&finList," target directory list [");
  poVar2 = std::operator<<(poVar2,(string *)&fileList);
  std::operator<<(poVar2,"]\n");
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x8b5,line._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&finList);
  std::ifstream::ifstream(&finList,fileList._M_dataplus._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&finList,&line,(bool *)0x0,-1);
    if (!bVar1) break;
    LoadLabels(this,line._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&finList);
  std::__cxx11::string::~string((string *)&fileList);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels()
{
  std::string fileList = this->CTest->GetBinaryDir();
  fileList += "/CMakeFiles";
  fileList += "/TargetDirectories.txt";
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " target directory list [" << fileList << "]\n",
                     this->Quiet);
  cmsys::ifstream finList(fileList.c_str());
  std::string line;
  while (cmSystemTools::GetLineFromStream(finList, line)) {
    this->LoadLabels(line.c_str());
  }
}